

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_enc.c
# Opt level: O0

int DeleteVP8Encoder(VP8Encoder *enc)

{
  long in_RDI;
  int ok;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  iVar1 = 1;
  if (in_RDI != 0) {
    iVar1 = VP8EncDeleteAlpha((VP8Encoder *)CONCAT44(1,in_stack_fffffffffffffff0));
    VP8TBufferClear((VP8TBuffer *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    WebPSafeFree((void *)0x1585f2);
  }
  return iVar1;
}

Assistant:

static int DeleteVP8Encoder(VP8Encoder* enc) {
  int ok = 1;
  if (enc != NULL) {
    ok = VP8EncDeleteAlpha(enc);
    VP8TBufferClear(&enc->tokens);
    WebPSafeFree(enc);
  }
  return ok;
}